

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.h
# Opt level: O2

void SHA1_reset(SHA1_CTX *context)

{
  context->state[0] = 0x67452301;
  context->state[1] = 0xefcdab89;
  context->state[2] = 0x98badcfe;
  context->state[3] = 0x10325476;
  *(undefined8 *)(context->state + 4) = 0xc3d2e1f0;
  context->count[1] = 0;
  return;
}

Assistant:

void SHA1_reset(SHA1_CTX* context)
{
	/* SHA1 initialization constants */
	context->state[0] = 0x67452301;
	context->state[1] = 0xEFCDAB89;
	context->state[2] = 0x98BADCFE;
	context->state[3] = 0x10325476;
	context->state[4] = 0xC3D2E1F0;
	context->count[0] = 0;
	context->count[1] = 0;
}